

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_flush_tests.cpp
# Opt level: O2

void __thiscall
validation_flush_tests::getcoinscachesizestate::test_method(getcoinscachesizestate *this)

{
  FastRandomContext *rng;
  long lVar1;
  CoinsCacheSizeState CVar2;
  Chainstate *this_00;
  CCoinsViewCache *this_01;
  size_t sVar3;
  Coin *pCVar4;
  unit_test_log_t *puVar5;
  CCoinsViewCache *pCVar6;
  iterator pvVar7;
  iterator pvVar8;
  begin *pbVar9;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  check_type cVar12;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  begin local_2a0;
  undefined1 local_281;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  begin local_f0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  float usage_percentage;
  CoinsCacheSizeState local_9c;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  uint COIN_SIZE;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  COutPoint res;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = ChainstateManager::ActiveChainstate
                      ((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                       super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pvVar7 = &DAT_0000001a;
  pvVar8 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock11,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
             ,0x1a,false);
  this_01 = Chainstate::CoinsTip(this_00);
  COIN_SIZE = 0x50;
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar8;
  msg.m_begin = pvVar7;
  file.m_end = (iterator)0x2c;
  file.m_begin = (iterator)&local_88;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
  usage_percentage = (float)Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
  local_9c = CRITICAL;
  _cVar12 = 0x5f5e24;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,_CoinsCacheSizeState,_boost::test_tools::assertion::op::NE<CoinsCacheSizeState,_CoinsCacheSizeState,_void>_>
  ::evaluate((assertion_result *)&local_f0,
             (binary_expr<boost::test_tools::assertion::value_expr<CoinsCacheSizeState>,_CoinsCacheSizeState,_boost::test_tools::assertion::op::NE<CoinsCacheSizeState,_CoinsCacheSizeState,_void>_>
              *)&usage_percentage,false);
  local_2a0.m_file_name.m_begin =
       "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0) != CoinsCacheSizeState::CRITICAL"
  ;
  local_2a0.m_file_name.m_end = "";
  pCVar6 = (CCoinsViewCache *)&res;
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
  ;
  local_a8 = "";
  pvVar7 = &DAT_00000001;
  pbVar9 = (begin *)0xe;
  res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_2a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f0,(lazy_ostream *)pCVar6,1,0xe,WARN,_cVar12,
             (size_t)&local_b0,0x2c);
  boost::detail::shared_count::~shared_count((shared_count *)&local_f0.m_line_num);
  sVar3 = CCoinsViewCache::DynamicMemoryUsage(this_01);
  if ((sVar3 == 0x20) || (sVar3 = CCoinsViewCache::DynamicMemoryUsage(this_01), sVar3 == 0x10)) {
    test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01,pCVar6);
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_138 = "";
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)pbVar9;
    msg_00.m_begin = pvVar7;
    file_00.m_end = (iterator)0x42;
    file_00.m_begin = (iterator)&local_140;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
               msg_00);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_160 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_158 = "";
    local_f0.m_file_name.m_begin = (iterator)CCoinsViewCache::DynamicMemoryUsage(this_01);
    pbVar9 = &local_f0;
    local_2a0.m_file_name.m_begin._0_4_ = 0x20;
    pvVar7 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&res,&local_160,0x42,1,2,pbVar9,"view.DynamicMemoryUsage()",&local_2a0,
               "is_64_bit ? 32U : 16U");
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_168 = "";
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = (iterator)pbVar9;
    msg_01.m_begin = pvVar7;
    file_01.m_end = (iterator)0x4d;
    file_01.m_begin = (iterator)&local_170;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
               msg_01);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_190 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_188 = "";
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    pbVar9 = &local_f0;
    local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
    local_2a0.m_file_name.m_begin = (iterator)((ulong)local_2a0.m_file_name.m_begin._4_4_ << 0x20);
    pvVar7 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
              (&res,&local_190,0x4d,1,2,pbVar9,
               "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)",&local_2a0,
               "CoinsCacheSizeState::OK");
    rng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
           super_BasicTestingSetup.m_rng;
    iVar10 = 3;
    while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
      pCVar6 = (CCoinsViewCache *)rng;
      AddTestCoin(&res,rng,this_01);
      test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01,pCVar6);
      local_1a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_198 = "";
      local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_02.m_end = (iterator)pbVar9;
      msg_02.m_begin = pvVar7;
      file_02.m_end = (iterator)0x52;
      file_02.m_begin = (iterator)&local_1a0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
                 msg_02);
      local_f0.m_file_name.m_end =
           (iterator)((ulong)local_f0.m_file_name.m_end & 0xffffffffffffff00);
      local_f0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01139f30;
      local_f0.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d8 = "";
      local_1c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_1b8 = "";
      pCVar4 = CCoinsViewCache::AccessCoin(this_01,&res);
      local_2a0.m_file_name.m_begin = (iterator)Coin::DynamicMemoryUsage(pCVar4);
      pvVar7 = (iterator)0x2;
      pbVar9 = &local_2a0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (&local_f0,&local_1c0,0x52,1,2,pbVar9,"view.AccessCoin(res).DynamicMemoryUsage()",
                 &COIN_SIZE,"COIN_SIZE");
      local_1d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_1c8 = "";
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_03.m_end = (iterator)pbVar9;
      msg_03.m_begin = pvVar7;
      file_03.m_end = &DAT_00000058;
      file_03.m_begin = (iterator)&local_1d0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
                 msg_03);
      local_f0.m_file_name.m_end =
           (iterator)((ulong)local_f0.m_file_name.m_end & 0xffffffffffffff00);
      local_f0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01139f30;
      local_f0.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d8 = "";
      local_1f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_1e8 = "";
      CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
      local_2a0.m_file_name.m_begin = (iterator)CONCAT44(local_2a0.m_file_name.m_begin._4_4_,CVar2);
      usage_percentage = 1.4013e-45;
      pvVar7 = (iterator)0x2;
      pbVar9 = &local_2a0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                (&local_f0,&local_1f0,0x58,1,2,pbVar9,
                 "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)",&usage_percentage,
                 "CoinsCacheSizeState::LARGE");
    }
    iVar10 = 5;
    do {
      iVar10 = iVar10 + -1;
      if (iVar10 == 0) break;
      pCVar6 = (CCoinsViewCache *)rng;
      AddTestCoin(&res,rng,this_01);
      test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01,pCVar6);
      CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    } while (CVar2 != CRITICAL);
    local_200 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_1f8 = "";
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = (iterator)pbVar9;
    msg_04.m_begin = pvVar7;
    file_04.m_end = (iterator)0x67;
    file_04.m_begin = (iterator)&local_200;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_210,
               msg_04);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_218 = "";
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    pbVar9 = &local_f0;
    local_2a0.m_file_name.m_begin._0_4_ = 2;
    pvVar7 = (iterator)0x2;
    local_f0.m_file_name.m_begin._0_4_ = CVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
              (&res,&local_220,0x67,1,2,pbVar9,
               "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)",&local_2a0,
               "CoinsCacheSizeState::CRITICAL");
    local_230 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_228 = "";
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_05.m_end = (iterator)pbVar9;
    msg_05.m_begin = pvVar7;
    file_05.m_end = (iterator)0x6c;
    file_05.m_begin = (iterator)&local_230;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_240,
               msg_05);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_250 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_248 = "";
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0x80000);
    pbVar9 = &local_f0;
    local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
    local_2a0.m_file_name.m_begin = (iterator)((ulong)local_2a0.m_file_name.m_begin._4_4_ << 0x20);
    pvVar7 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
              (&res,&local_250,0x6c,1,2,pbVar9,
               "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 1 << 19)",&local_2a0,
               "CoinsCacheSizeState::OK");
    iVar10 = 3;
    while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
      pCVar6 = (CCoinsViewCache *)rng;
      AddTestCoin(&res,rng,this_01);
      test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01,pCVar6);
      local_260 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_258 = "";
      local_270 = &boost::unit_test::basic_cstring<char_const>::null;
      local_268 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_06.m_end = (iterator)pbVar9;
      msg_06.m_begin = pvVar7;
      file_06.m_end = (iterator)0x73;
      file_06.m_begin = (iterator)&local_260;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_270,
                 msg_06);
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           (long)"\x05\x04\x03\x02\x01" + 5;
      local_280 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_278 = "";
      CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0x80000);
      local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
      local_2a0.m_file_name.m_begin =
           (iterator)((ulong)local_2a0.m_file_name.m_begin & 0xffffffff00000000);
      pvVar7 = (iterator)0x2;
      pbVar9 = &local_f0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                (&res,&local_280,0x73,1,2,pbVar9,
                 "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 1 << 19)",&local_2a0,
                 "CoinsCacheSizeState::OK");
    }
    pCVar6 = (CCoinsViewCache *)rng;
    AddTestCoin(&res,rng,this_01);
    test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01,pCVar6);
    sVar3 = CCoinsViewCache::DynamicMemoryUsage(this_01);
    usage_percentage = (float)sVar3 / 263680.0;
    local_2a0.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2a0.m_file_name.m_end = "";
    local_2a0.m_line_num = 0x7e;
    puVar5 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_281,(log_level)puVar5);
    local_f0.m_file_name.m_end = (iterator)((ulong)local_f0.m_file_name.m_end & 0xffffffffffffff00);
    local_f0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_0113fd50;
    local_f0.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
    local_d8 = "CoinsTip usage percentage: ";
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113fd90;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = &local_f0;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &usage_percentage;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_281,(lazy_ostream *)&res);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_281);
    local_2b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2a8 = "";
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x5f67b5;
    msg_07.m_end = (iterator)pbVar9;
    msg_07.m_begin = pvVar7;
    file_07.m_end = (iterator)0x7f;
    file_07.m_begin = (iterator)&local_2b0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2c0,
               msg_07);
    local_f0.m_file_name.m_end = (iterator)0x0;
    local_f0.m_line_num = 0;
    local_2a0.m_file_name.m_begin = "usage_percentage >= 0.9";
    local_2a0.m_file_name.m_end = "";
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_2a0;
    local_2d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2c8 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    local_f0.m_file_name.m_begin._0_1_ = 0.9 <= usage_percentage;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_f0,(lazy_ostream *)&res,1,0,WARN,_cVar12,
               (size_t)&local_2d0,0x7f);
    boost::detail::shared_count::~shared_count((shared_count *)&local_f0.m_line_num);
    local_2e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2d8 = "";
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar12 = 0x5f6891;
    msg_08.m_end = pvVar8;
    msg_08.m_begin = pvVar7;
    file_08.m_end = (iterator)0x80;
    file_08.m_begin = (iterator)&local_2e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f0,
               msg_08);
    local_f0.m_file_name.m_begin =
         (iterator)CONCAT71(local_f0.m_file_name.m_begin._1_7_,usage_percentage < 1.0);
    local_f0.m_file_name.m_end = (iterator)0x0;
    local_f0.m_line_num = 0;
    local_2a0.m_file_name.m_begin = "usage_percentage < 1";
    local_2a0.m_file_name.m_end = "";
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_2a0;
    local_300 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_2f8 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_f0,(lazy_ostream *)&res,1,0,WARN,_cVar12,
               (size_t)&local_300,0x80);
    boost::detail::shared_count::~shared_count((shared_count *)&local_f0.m_line_num);
    local_310 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_308 = "";
    local_320 = &boost::unit_test::basic_cstring<char_const>::null;
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = pvVar8;
    msg_09.m_begin = pvVar7;
    file_09.m_end = (iterator)0x83;
    file_09.m_begin = (iterator)&local_310;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_320,
               msg_09);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_330 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_328 = "";
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0x400);
    pbVar9 = &local_f0;
    local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
    local_2a0.m_file_name.m_begin = (iterator)CONCAT44(local_2a0.m_file_name.m_begin._4_4_,1);
    pvVar7 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
              (&res,&local_330,0x83,1,2,pbVar9,
               "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 1 << 10)",&local_2a0,
               "CoinsCacheSizeState::LARGE");
    iVar10 = 1000;
    while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
      AddTestCoin(&res,rng,this_01);
      local_340 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_338 = "";
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_10.m_end = (iterator)pbVar9;
      msg_10.m_begin = pvVar7;
      file_10.m_end = (iterator)0x8b;
      file_10.m_begin = (iterator)&local_340;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_350,
                 msg_10);
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           boost::unit_test::lazy_ostream::inst;
      res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           (long)"\x05\x04\x03\x02\x01" + 5;
      local_360 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_358 = "";
      CVar2 = Chainstate::GetCoinsCacheSizeState(this_00);
      local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
      local_2a0.m_file_name.m_begin =
           (iterator)((ulong)local_2a0.m_file_name.m_begin & 0xffffffff00000000);
      pvVar7 = (iterator)0x2;
      pbVar9 = &local_f0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
                (&res,&local_360,0x8b,1,2,&local_f0,"chainstate.GetCoinsCacheSizeState()",&local_2a0
                 ,"CoinsCacheSizeState::OK");
    }
    local_370 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_368 = "";
    local_380 = &boost::unit_test::basic_cstring<char_const>::null;
    local_378 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_11.m_end = (iterator)pbVar9;
    msg_11.m_begin = pvVar7;
    file_11.m_end = (iterator)0x92;
    file_11.m_begin = (iterator)&local_370;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_380,
               msg_11);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_390 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_388 = "";
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    pbVar9 = &local_f0;
    local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
    local_2a0.m_file_name.m_begin = (iterator)CONCAT44(local_2a0.m_file_name.m_begin._4_4_,2);
    pvVar7 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
              (&res,&local_390,0x92,1,2,pbVar9,
               "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)",&local_2a0,
               "CoinsCacheSizeState::CRITICAL");
    RandomMixin<FastRandomContext>::rand256
              ((uint256 *)&res,&rng->super_RandomMixin<FastRandomContext>);
    CCoinsViewCache::SetBestBlock(this_01,(uint256 *)&res);
    local_3a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_398 = "";
    local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = (iterator)pbVar9;
    msg_12.m_begin = pvVar7;
    file_12.m_end = (iterator)0x95;
    file_12.m_begin = (iterator)&local_3a0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3b0,
               msg_12);
    _cVar12 = 0x5f6c9f;
    bVar11 = CCoinsViewCache::Flush(this_01);
    local_f0.m_file_name.m_begin = (iterator)CONCAT71(local_f0.m_file_name.m_begin._1_7_,bVar11);
    local_f0.m_file_name.m_end = (char *)0x0;
    local_f0.m_line_num = 0;
    local_2a0.m_file_name.m_begin = "view.Flush()";
    local_2a0.m_file_name.m_end = "";
    pCVar6 = (CCoinsViewCache *)&res;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_2a0;
    local_3c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_3b8 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_f0,(lazy_ostream *)pCVar6,1,0,WARN,_cVar12,
               (size_t)&local_3c0,0x95);
    boost::detail::shared_count::~shared_count((shared_count *)&local_f0.m_line_num);
    test_method::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01,pCVar6);
    local_3d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_3c8 = "";
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar8;
    msg_13.m_begin = pvVar7;
    file_13.m_end = (iterator)0x9a;
    file_13.m_begin = (iterator)&local_3d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3e0,
               msg_13);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_3f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_3e8 = "";
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
    local_2a0.m_file_name.m_begin =
         (iterator)((ulong)local_2a0.m_file_name.m_begin & 0xffffffff00000000);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
              (&res,&local_3f0,0x9a,1,2,&local_f0,
               "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)",&local_2a0,
               "CoinsCacheSizeState::OK");
  }
  else {
    iVar10 = 1000;
    while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
      AddTestCoin(&res,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
                        super_BasicTestingSetup.m_rng,this_01);
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_b8 = "";
      local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_14.m_end = (iterator)pbVar9;
      msg_14.m_begin = pvVar7;
      file_14.m_end = (iterator)0x36;
      file_14.m_begin = (iterator)&local_c0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_d0,
                 msg_14);
      local_f0.m_file_name.m_end =
           (iterator)((ulong)local_f0.m_file_name.m_end & 0xffffffffffffff00);
      local_f0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_01139f30;
      local_f0.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
      local_d8 = "";
      local_100 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
      ;
      local_f8 = "";
      pCVar4 = CCoinsViewCache::AccessCoin(this_01,&res);
      local_2a0.m_file_name.m_begin = (iterator)Coin::DynamicMemoryUsage(pCVar4);
      pvVar7 = (iterator)0x2;
      pbVar9 = &local_2a0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
                (&local_f0,&local_100,0x36,1,2,pbVar9,"view.AccessCoin(res).DynamicMemoryUsage()",
                 &COIN_SIZE,"COIN_SIZE");
    }
    local_110 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_108 = "";
    local_120 = &boost::unit_test::basic_cstring<char_const>::null;
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_15.m_end = (iterator)pbVar9;
    msg_15.m_begin = pvVar7;
    file_15.m_end = (iterator)0x3b;
    file_15.m_begin = (iterator)&local_110;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_120,
               msg_15);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_01139f30;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
         (long)"\x05\x04\x03\x02\x01" + 5;
    local_130 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_128 = "";
    CVar2 = Chainstate::GetCoinsCacheSizeState(this_00,0x40200,0);
    local_f0.m_file_name.m_begin = (iterator)CONCAT44(local_f0.m_file_name.m_begin._4_4_,CVar2);
    local_2a0.m_file_name.m_begin = (iterator)CONCAT44(local_2a0.m_file_name.m_begin._4_4_,2);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CoinsCacheSizeState,CoinsCacheSizeState>
              (&res,&local_130,0x3b,1,2,&local_f0,
               "chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0)",&local_2a0,
               "CoinsCacheSizeState::CRITICAL");
    local_f0.m_file_name.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_flush_tests.cpp"
    ;
    local_f0.m_file_name.m_end = "";
    local_f0.m_line_num = 0x3d;
    puVar5 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_2a0,(log_level)puVar5);
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113fd10;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    res.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = anon_var_dwarf_157c3df;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_2a0,(lazy_ostream *)&res);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_2a0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(getcoinscachesizestate)
{
    Chainstate& chainstate{m_node.chainman->ActiveChainstate()};

    constexpr bool is_64_bit = sizeof(void*) == 8;

    LOCK(::cs_main);
    auto& view = chainstate.CoinsTip();

    // The number of bytes consumed by coin's heap data, i.e. CScript
    // (prevector<28, unsigned char>) when assigned 56 bytes of data per above.
    //
    // See also: Coin::DynamicMemoryUsage().
    constexpr unsigned int COIN_SIZE = is_64_bit ? 80 : 64;

    auto print_view_mem_usage = [](CCoinsViewCache& view) {
        BOOST_TEST_MESSAGE("CCoinsViewCache memory usage: " << view.DynamicMemoryUsage());
    };

    // PoolResource defaults to 256 KiB that will be allocated, so we'll take that and make it a bit larger.
    constexpr size_t MAX_COINS_CACHE_BYTES = 262144 + 512;

    // Without any coins in the cache, we shouldn't need to flush.
    BOOST_TEST(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 0) != CoinsCacheSizeState::CRITICAL);

    // If the initial memory allocations of cacheCoins don't match these common
    // cases, we can't really continue to make assertions about memory usage.
    // End the test early.
    if (view.DynamicMemoryUsage() != 32 && view.DynamicMemoryUsage() != 16) {
        // Add a bunch of coins to see that we at least flip over to CRITICAL.

        for (int i{0}; i < 1000; ++i) {
            const COutPoint res = AddTestCoin(m_rng, view);
            BOOST_CHECK_EQUAL(view.AccessCoin(res).DynamicMemoryUsage(), COIN_SIZE);
        }

        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0),
            CoinsCacheSizeState::CRITICAL);

        BOOST_TEST_MESSAGE("Exiting cache flush tests early due to unsupported arch");
        return;
    }

    print_view_mem_usage(view);
    BOOST_CHECK_EQUAL(view.DynamicMemoryUsage(), is_64_bit ? 32U : 16U);

    // We should be able to add COINS_UNTIL_CRITICAL coins to the cache before going CRITICAL.
    // This is contingent not only on the dynamic memory usage of the Coins
    // that we're adding (COIN_SIZE bytes per), but also on how much memory the
    // cacheCoins (unordered_map) preallocates.
    constexpr int COINS_UNTIL_CRITICAL{3};

    // no coin added, so we have plenty of space left.
    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes*/ 0),
        CoinsCacheSizeState::OK);

    for (int i{0}; i < COINS_UNTIL_CRITICAL; ++i) {
        const COutPoint res = AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        BOOST_CHECK_EQUAL(view.AccessCoin(res).DynamicMemoryUsage(), COIN_SIZE);

        // adding first coin causes the MemoryResource to allocate one 256 KiB chunk of memory,
        // pushing us immediately over to LARGE
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 0),
            CoinsCacheSizeState::LARGE);
    }

    // Adding some additional coins will push us over the edge to CRITICAL.
    for (int i{0}; i < 4; ++i) {
        AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        if (chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0) ==
            CoinsCacheSizeState::CRITICAL) {
            break;
        }
    }

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/0),
        CoinsCacheSizeState::CRITICAL);

    // Passing non-zero max mempool usage (512 KiB) should allow us more headroom.
    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 1 << 19),
        CoinsCacheSizeState::OK);

    for (int i{0}; i < 3; ++i) {
        AddTestCoin(m_rng, view);
        print_view_mem_usage(view);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes=*/ 1 << 19),
            CoinsCacheSizeState::OK);
    }

    // Adding another coin with the additional mempool room will put us >90%
    // but not yet critical.
    AddTestCoin(m_rng, view);
    print_view_mem_usage(view);

    // Only perform these checks on 64 bit hosts; I haven't done the math for 32.
    if (is_64_bit) {
        float usage_percentage = (float)view.DynamicMemoryUsage() / (MAX_COINS_CACHE_BYTES + (1 << 10));
        BOOST_TEST_MESSAGE("CoinsTip usage percentage: " << usage_percentage);
        BOOST_CHECK(usage_percentage >= 0.9);
        BOOST_CHECK(usage_percentage < 1);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, /*max_mempool_size_bytes*/ 1 << 10), // 1024
            CoinsCacheSizeState::LARGE);
    }

    // Using the default max_* values permits way more coins to be added.
    for (int i{0}; i < 1000; ++i) {
        AddTestCoin(m_rng, view);
        BOOST_CHECK_EQUAL(
            chainstate.GetCoinsCacheSizeState(),
            CoinsCacheSizeState::OK);
    }

    // Flushing the view does take us back to OK because ReallocateCache() is called

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0),
        CoinsCacheSizeState::CRITICAL);

    view.SetBestBlock(m_rng.rand256());
    BOOST_CHECK(view.Flush());
    print_view_mem_usage(view);

    BOOST_CHECK_EQUAL(
        chainstate.GetCoinsCacheSizeState(MAX_COINS_CACHE_BYTES, 0),
        CoinsCacheSizeState::OK);
}